

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_HeaderFieldNodeMissingNameAttribute::
~TestreadFromDocument_HeaderFieldNodeMissingNameAttribute
          (TestreadFromDocument_HeaderFieldNodeMissingNameAttribute *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(readFromDocument_HeaderFieldNodeMissingNameAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field required='Y' />"  // name attribute missing
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
        "</fields>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}